

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_KDReportsPreviewWidget.cpp
# Opt level: O1

int __thiscall KDReports::PreviewWidget::qt_metacall(PreviewWidget *this,Call _c,int _id,void **_a)

{
  int _id_00;
  undefined4 in_register_00000014;
  Call _c_00;
  
  _id_00 = QWidget::qt_metacall((Call)this,_c,(void **)CONCAT44(in_register_00000014,_id));
  if (_id_00 < 0) {
    return _id_00;
  }
  if (_c == RegisterMethodArgumentMetaType) {
    if (3 < _id_00) goto LAB_001287fe;
    _c_00 = RegisterMethodArgumentMetaType;
  }
  else {
    if (_c != InvokeMetaMethod) {
      return _id_00;
    }
    if (3 < _id_00) goto LAB_001287fe;
    _c_00 = InvokeMetaMethod;
  }
  qt_static_metacall((QObject *)this,_c_00,_id_00,_a);
LAB_001287fe:
  return _id_00 + -4;
}

Assistant:

int KDReports::PreviewWidget::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QWidget::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 4)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 4;
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 4)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 4;
    }
    return _id;
}